

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O1

void multiple_perform_undo_proc(Am_Object *undo_handler)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object old_command;
  Am_Object last_command;
  Am_Value_List command_list;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  Am_Value local_30;
  Am_Value local_20;
  Am_Object local_10;
  
  Am_Value_List::Am_Value_List(&local_40);
  pAVar2 = Am_Object::Get(undo_handler,0xc5,0);
  Am_Value_List::operator=(&local_40,pAVar2);
  bVar1 = Am_Value_List::Empty(&local_40);
  if (!bVar1) {
    Am_Value_List::Start(&local_40);
    local_50.data = (Am_Object_Data *)0x0;
    pAVar2 = Am_Value_List::Get(&local_40);
    Am_Object::operator=(&local_50,pAVar2);
    Am_Value_List::Delete(&local_40,false);
    Am_Value::Am_Value(&local_20,&Am_No_Value);
    Am_Value::Am_Value(&local_30,&Am_No_Value);
    am_perform_on_cmd_and_impls
              (&local_10,(Am_Slot_Key)&local_50,true,(Am_Value *)0x0,&local_20,SUB81(&local_30,0));
    Am_Object::~Am_Object(&local_10);
    Am_Value::~Am_Value(&local_30);
    Am_Value::~Am_Value(&local_20);
    local_58.data = (Am_Object_Data *)0x0;
    pAVar2 = Am_Object::Get(undo_handler,0x17a,0);
    Am_Object::operator=(&local_58,pAVar2);
    bVar1 = Am_Object::Valid(&local_58);
    if (bVar1) {
      Am_Object::Am_Object(&local_48,&local_58);
      destroy_command_tree(&local_48);
      Am_Object::~Am_Object(&local_48);
    }
    value = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
    Am_Object::Set(undo_handler,0x17a,value,0);
    Am_Object::Note_Changed(undo_handler,0xc5);
    Am_Object::~Am_Object(&local_58);
    Am_Object::~Am_Object(&local_50);
    Am_Value_List::~Am_Value_List(&local_40);
    return;
  }
  Am_Error("Command list is empty for Multiple Undo Handler");
}

Assistant:

Am_Define_Method(Am_Object_Method, void, multiple_perform_undo,
                 (Am_Object undo_handler))
{
  Am_Value_List command_list;
  command_list = undo_handler.Get(Am_COMMAND);
  if (command_list.Empty())
    Am_Error("Command list is empty for Multiple Undo Handler");
  else { // undo the current item and all its Am_IMPLEMENTATION_CHILD
    command_list.Start();
    Am_Object last_command;
    last_command = command_list.Get();
    // false so don't copy the list
    command_list.Delete(false); // pop it from the undo list
    // now do the undo action
    am_perform_on_cmd_and_impls(last_command, Am_UNDO_METHOD);

    // remember the command in case Redo
    Am_Object old_command;
    old_command = undo_handler.Get(Am_LAST_UNDONE_COMMAND);
    // destroy any old one saved there
    if (old_command.Valid())
      destroy_command_tree(old_command);
    // now save the new last_command
    undo_handler.Set(Am_LAST_UNDONE_COMMAND, last_command);
    undo_handler.Note_Changed(Am_COMMAND); //destructively modified value
  }
}